

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

Vec4 __thiscall
deqp::gles3::Functional::TriangleDerivateCase::getSurfaceThreshold(TriangleDerivateCase *this)

{
  RenderTarget *pRVar1;
  Vector<float,_4> *res;
  long in_RSI;
  undefined1 auVar2 [16];
  float fVar3;
  undefined8 in_XMM1_Qa;
  float fVar4;
  Vec4 VVar5;
  
  if (*(int *)(in_RSI + 0xe8) == 0) {
    pRVar1 = Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
    fVar3 = (float)((8 - (pRVar1->m_pixelFormat).redBits) * 0x800000 + 0x3f800000);
    fVar4 = (float)((8 - (pRVar1->m_pixelFormat).greenBits) * 0x800000 + 0x3f800000);
    in_XMM1_Qa = CONCAT44(fVar4,fVar3);
    auVar2._0_4_ = (float)(int)fVar3;
    auVar2._4_4_ = (float)(int)fVar4;
    auVar2._8_4_ = (float)(int)(float)((8 - (pRVar1->m_pixelFormat).blueBits) * 0x800000 +
                                      0x3f800000);
    auVar2._12_4_ =
         (float)(int)(float)((8 - (pRVar1->m_pixelFormat).alphaBits) * 0x800000 + 0x3f800000);
    auVar2 = divps(auVar2,_DAT_01a9ab80);
  }
  else {
    auVar2 = _DAT_01c117b0;
    if (*(int *)(in_RSI + 0xe8) != 1) {
      auVar2 = ZEXT816(0);
    }
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)auVar2._0_8_;
  (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = (TestContext *)auVar2._8_8_;
  VVar5.m_data._0_8_ = auVar2._0_8_;
  VVar5.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar5.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Vec4)VVar5.m_data;
}

Assistant:

tcu::Vec4 TriangleDerivateCase::getSurfaceThreshold (void) const
{
	switch (m_surfaceType)
	{
		case SURFACETYPE_DEFAULT_FRAMEBUFFER:
		{
			const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
			const tcu::IVec4		channelBits		(pixelFormat.redBits, pixelFormat.greenBits, pixelFormat.blueBits, pixelFormat.alphaBits);
			const tcu::IVec4		intThreshold	= tcu::IVec4(1) << (8 - channelBits);
			const tcu::Vec4			normThreshold	= intThreshold.asFloat() / 255.0f;

			return normThreshold;
		}

		case SURFACETYPE_UNORM_FBO:				return tcu::IVec4(1).asFloat() / 255.0f;
		case SURFACETYPE_FLOAT_FBO:				return tcu::Vec4(0.0f);
		default:
			DE_ASSERT(false);
			return tcu::Vec4(0.0f);
	}
}